

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_tests.cpp
# Opt level: O0

void __thiscall bloom_tests::bloom_create_insert_key::test_method(bloom_create_insert_key *this)

{
  Span<const_unsigned_char> vKey;
  Span<const_unsigned_char> vKey_00;
  string *in_RDI;
  long in_FS_OFFSET;
  DataStream stream;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchPubKey;
  CKey key;
  CBloomFilter filter;
  array<std::byte,_13UL> expected;
  uint160 hash;
  CPubKey pubkey;
  string strSecret;
  CBloomFilter *in_stack_fffffffffffffd78;
  char *in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd88;
  CKey *in_stack_fffffffffffffda0;
  size_t in_stack_fffffffffffffda8;
  undefined7 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb7;
  lazy_ostream *in_stack_fffffffffffffdb8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffdc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  undefined8 in_stack_fffffffffffffdd0;
  uint nElements;
  CBloomFilter *in_stack_fffffffffffffdd8;
  byte *in_stack_fffffffffffffe28;
  equal_coll_impl *in_stack_fffffffffffffe38;
  lazy_ostream local_1b8 [2];
  __normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
  in_stack_fffffffffffffe70;
  __normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
  in_stack_fffffffffffffe78;
  allocator<char> local_d9 [48];
  undefined8 local_a9;
  undefined4 local_a1;
  undefined1 local_9d;
  undefined8 local_9c;
  undefined8 uStack_94;
  undefined4 local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined4 local_78;
  long local_8;
  
  nElements = (uint)((ulong)in_stack_fffffffffffffdd0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0,
             (allocator<char> *)in_stack_fffffffffffffdb8);
  std::allocator<char>::~allocator(local_d9);
  DecodeSecret(in_RDI);
  CKey::GetPubKey(in_stack_fffffffffffffda0);
  CPubKey::begin((CPubKey *)in_stack_fffffffffffffd78);
  CPubKey::end((CPubKey *)in_stack_fffffffffffffd88);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffffd78);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            (in_stack_fffffffffffffdc0,(uchar *)in_stack_fffffffffffffdc8,
             (uchar *)in_stack_fffffffffffffdb8,
             (allocator_type *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffffd78);
  CBloomFilter::CBloomFilter
            (in_stack_fffffffffffffdd8,nElements,(double)in_stack_fffffffffffffdc8,
             (uint)((ulong)in_stack_fffffffffffffdc0 >> 0x20),
             (uchar)((ulong)in_stack_fffffffffffffdc0 >> 0x18));
  Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((Span<const_unsigned_char> *)in_stack_fffffffffffffd88,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd80,
             in_stack_fffffffffffffd78);
  vKey.m_size = in_stack_fffffffffffffda8;
  vKey.m_data = &in_stack_fffffffffffffda0->fCompressed;
  CBloomFilter::insert((CBloomFilter *)in_stack_fffffffffffffd88,vKey);
  CPubKey::GetID((CPubKey *)in_stack_fffffffffffffda0);
  local_78 = local_8c;
  local_88 = local_9c;
  uStack_80 = uStack_94;
  Span<const_unsigned_char>::Span<uint160>
            ((Span<const_unsigned_char> *)in_stack_fffffffffffffd88,
             (uint160 *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  vKey_00.m_size = in_stack_fffffffffffffda8;
  vKey_00.m_data = &in_stack_fffffffffffffda0->fCompressed;
  CBloomFilter::insert((CBloomFilter *)in_stack_fffffffffffffd88,vKey_00);
  DataStream::DataStream((DataStream *)in_stack_fffffffffffffd78);
  DataStream::operator<<
            ((DataStream *)in_stack_fffffffffffffd88,(CBloomFilter *)in_stack_fffffffffffffd80);
  local_a9 = 0x86bc18f03;
  local_a1 = 0;
  local_9d = 1;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
               (unsigned_long)in_stack_fffffffffffffd78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd78);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffdb8,
               (const_string *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
               in_stack_fffffffffffffda8,(const_string *)in_stack_fffffffffffffda0);
    DataStream::begin((DataStream *)in_stack_fffffffffffffd88);
    DataStream::end((DataStream *)in_stack_fffffffffffffd80);
    std::array<std::byte,_13UL>::begin((array<std::byte,_13UL> *)in_stack_fffffffffffffd78);
    std::array<std::byte,_13UL>::end((array<std::byte,_13UL> *)in_stack_fffffffffffffd78);
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              (in_stack_fffffffffffffe38,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
               (byte *)in_RDI,in_stack_fffffffffffffe28);
    in_stack_fffffffffffffdb8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd80,(char (*) [1])in_stack_fffffffffffffd78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
               (unsigned_long)in_stack_fffffffffffffd78);
    in_stack_fffffffffffffd88 = "stream.end()";
    in_stack_fffffffffffffd80 = "stream.begin()";
    in_stack_fffffffffffffd78 = (CBloomFilter *)&DAT_00000004;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xfffffffffffffe70,local_1b8,
               (const_string *)&stack0xfffffffffffffe38,99,CHECK,CHECK_EQUAL_COLL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffd78);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffd78);
    in_stack_fffffffffffffdb7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffdb7);
  DataStream::~DataStream((DataStream *)in_stack_fffffffffffffd78);
  CBloomFilter::~CBloomFilter(in_stack_fffffffffffffd78);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd88);
  CKey::~CKey((CKey *)in_stack_fffffffffffffd78);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(bloom_create_insert_key)
{
    std::string strSecret = std::string("5Kg1gnAjaLfKiwhhPpGS3QfRg2m6awQvaj98JCZBZQ5SuS2F15C");
    CKey key = DecodeSecret(strSecret);
    CPubKey pubkey = key.GetPubKey();
    std::vector<unsigned char> vchPubKey(pubkey.begin(), pubkey.end());

    CBloomFilter filter(2, 0.001, 0, BLOOM_UPDATE_ALL);
    filter.insert(vchPubKey);
    uint160 hash = pubkey.GetID();
    filter.insert(hash);

    DataStream stream{};
    stream << filter;

    constexpr auto expected{"038fc16b080000000000000001"_hex};
    BOOST_CHECK_EQUAL_COLLECTIONS(stream.begin(), stream.end(), expected.begin(), expected.end());
}